

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-bson.c
# Opt level: O0

void pack_dict(lua_State *L,bson *b,_Bool isarray)

{
  int off;
  int iVar1;
  char *pcVar2;
  lua_Integer lVar3;
  size_t local_58;
  size_t sz;
  char *key;
  char numberkey [32];
  int kt;
  int length;
  _Bool isarray_local;
  bson *b_local;
  lua_State *L_local;
  
  off = reserve_length(b);
  lua_pushnil(L);
  while( true ) {
    while( true ) {
      while( true ) {
        iVar1 = lua_next(L,-2);
        if (iVar1 == 0) {
          write_byte(b,'\0');
          write_length(b,b->size - off,off);
          return;
        }
        numberkey._28_4_ = lua_type(L,-2);
        sz = 0;
        if (!isarray) break;
        if (numberkey._28_4_ != 3) {
          pcVar2 = lua_typename(L,numberkey._28_4_);
          luaL_error(L,"Invalid array key type : %s",pcVar2);
          return;
        }
        lVar3 = lua_tointegerx(L,-2,(int *)0x0);
        iVar1 = bson_numstr((char *)&key,(int)lVar3 - 1);
        local_58 = (size_t)iVar1;
        sz = (size_t)&key;
        append_one(b,L,(char *)sz,local_58);
        lua_settop(L,-2);
      }
      if (numberkey._28_4_ != 3) break;
      lua_pushvalue(L,-2);
      lua_rotate(L,-2,1);
      sz = (size_t)lua_tolstring(L,-2,&local_58);
      append_one(b,L,(char *)sz,local_58);
      lua_settop(L,-3);
    }
    if (numberkey._28_4_ != 4) break;
    sz = (size_t)lua_tolstring(L,-2,&local_58);
    append_one(b,L,(char *)sz,local_58);
    lua_settop(L,-2);
  }
  pcVar2 = lua_typename(L,numberkey._28_4_);
  luaL_error(L,"Invalid key type : %s",pcVar2);
  return;
}

Assistant:

static void
pack_dict(lua_State *L, struct bson *b, bool isarray) {
	int length = reserve_length(b);
	lua_pushnil(L);
	while(lua_next(L,-2) != 0) {
		int kt = lua_type(L, -2);
		char numberkey[32];
		const char * key = NULL;
		size_t sz;
		if (isarray) {
			if (kt != LUA_TNUMBER) {
				luaL_error(L, "Invalid array key type : %s", lua_typename(L, kt));
				return;
			}
			sz = bson_numstr(numberkey, (unsigned int)lua_tointeger(L,-2)-1);
			key = numberkey;

			append_one(b, L, key, sz);
			lua_pop(L,1);
		} else {
			switch(kt) {
			case LUA_TNUMBER:
				// copy key, don't change key type
				lua_pushvalue(L,-2);
				lua_insert(L,-2);
				key = lua_tolstring(L,-2,&sz);
				append_one(b, L, key, sz);
				lua_pop(L,2);
				break;
			case LUA_TSTRING:
				key = lua_tolstring(L,-2,&sz);
				append_one(b, L, key, sz);
				lua_pop(L,1);
				break;
			default:
				luaL_error(L, "Invalid key type : %s", lua_typename(L, kt));
				return;
			}
		}
	}
	write_byte(b,0);
	write_length(b, b->size - length, length);
}